

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

string * __thiscall
jbcoin::STAmount::getFullText_abi_cxx11_(string *__return_storage_ptr__,STAmount *this)

{
  bool bVar1;
  AccountID *b;
  Currency *currency;
  AccountID *account;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  STAmount *local_18;
  STAmount *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (STAmount *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  (*(this->super_STBase)._vptr_STBase[6])(&local_90);
  std::operator+(&local_70,&local_90,"/");
  to_string_abi_cxx11_(&local_b0,(jbcoin *)&this->mIssue,currency);
  std::operator+(&local_50,&local_70,&local_b0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if ((this->mIsNative & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    bVar1 = isXRP(this);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0");
    }
    else {
      b = noAccount();
      bVar1 = jbcoin::operator==(&(this->mIssue).account,b);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"1");
      }
      else {
        to_string_abi_cxx11_(&local_d0,(jbcoin *)&(this->mIssue).account,account);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STAmount::getFullText () const
{
    std::string ret;

    ret.reserve(64);
    ret = getText () + "/" + to_string (mIssue.currency);

    if (!mIsNative)
    {
        ret += "/";

        if (isXRP (*this))
            ret += "0";
        else if (mIssue.account == noAccount())
            ret += "1";
        else
            ret += to_string (mIssue.account);
    }

    return ret;
}